

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lest.hpp
# Opt level: O3

void __thiscall lest::confirm::~confirm(confirm *this)

{
  pointer pcVar1;
  size_type sVar2;
  ostream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  long *plVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_c8;
  size_type local_c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_a8;
  size_type local_a0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_88;
  size_type local_80;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  long *local_68;
  long local_60;
  long local_58 [2];
  long *local_48;
  long local_40;
  long local_38 [2];
  
  if (this->failures < 1) {
    if ((this->output).opt.pass != true) goto LAB_00112c2b;
    poVar3 = (this->super_action).os;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,"All ",4);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," selected ",10);
    local_68 = local_58;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"test","");
    if (this->selected == 1) {
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_68,local_60 + (long)local_68);
    }
    else {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_68,local_60 + (long)local_68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_e8,"s");
      local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
        local_b8._8_8_ = local_e8.field_2._8_8_;
        local_c8 = &local_b8;
      }
      local_b8._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
      local_c0 = local_e8._M_string_length;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_c8->_M_local_buf,local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_a8 = &local_98;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_a8,"passed.\n","");
    sVar2 = local_a0;
    if (local_a8 == &local_98) {
      local_e8.field_2._8_8_ = local_98._8_8_;
      local_a8 = &local_e8.field_2;
    }
    local_e8.field_2._M_allocated_capacity._1_7_ = local_98._M_allocated_capacity._1_7_;
    local_e8.field_2._M_local_buf[0] = local_98._M_local_buf[0];
    local_e8._M_string_length = local_a0;
    local_a0 = 0;
    local_98._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)local_a8;
    paVar4 = local_a8;
    local_a8 = &local_98;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,paVar4->_M_local_buf,sVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_a8 != &local_98) {
      operator_delete(local_a8,CONCAT71(local_98._M_allocated_capacity._1_7_,
                                        local_98._M_local_buf[0]) + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8._M_allocated_capacity + 1);
    }
    plVar5 = local_68;
    if (local_68 == local_58) goto LAB_00112c2b;
  }
  else {
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)(this->super_action).os,this->failures);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," out of ",8);
    poVar3 = (ostream *)std::ostream::operator<<((ostream *)poVar3,this->selected);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," selected ",10);
    local_48 = local_38;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"test","");
    if (this->selected == 1) {
      local_c8 = &local_b8;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_c8,local_48,local_40 + (long)local_48);
    }
    else {
      local_e8._M_dataplus._M_p = (pointer)&local_e8.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_e8,local_48,local_40 + (long)local_48);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                (&local_e8,"s");
      local_c8 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)local_e8._M_dataplus._M_p;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_e8._M_dataplus._M_p == &local_e8.field_2) {
        local_b8._8_8_ = local_e8.field_2._8_8_;
        local_c8 = &local_b8;
      }
      local_b8._M_allocated_capacity = local_e8.field_2._M_allocated_capacity;
      local_c0 = local_e8._M_string_length;
    }
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       (poVar3,local_c8->_M_local_buf,local_c0);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
    local_88 = &local_78;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"failed.\n","");
    sVar2 = local_80;
    if (local_88 == &local_78) {
      local_e8.field_2._8_8_ = local_78._8_8_;
      local_88 = &local_e8.field_2;
    }
    local_e8.field_2._M_allocated_capacity._1_7_ = local_78._M_allocated_capacity._1_7_;
    local_e8.field_2._M_local_buf[0] = local_78._M_local_buf[0];
    local_e8._M_string_length = local_80;
    local_80 = 0;
    local_78._M_local_buf[0] = '\0';
    local_e8._M_dataplus._M_p = (pointer)local_88;
    paVar4 = local_88;
    local_88 = &local_78;
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,paVar4->_M_local_buf,sVar2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_e8._M_dataplus._M_p != &local_e8.field_2) {
      operator_delete(local_e8._M_dataplus._M_p,local_e8.field_2._M_allocated_capacity + 1);
    }
    if (local_88 != &local_78) {
      operator_delete(local_88,CONCAT71(local_78._M_allocated_capacity._1_7_,
                                        local_78._M_local_buf[0]) + 1);
    }
    if (local_c8 != &local_b8) {
      operator_delete(local_c8,local_b8._M_allocated_capacity + 1);
    }
    local_58[0] = local_38[0];
    plVar5 = local_48;
    if (local_48 == local_38) goto LAB_00112c2b;
  }
  operator_delete(plVar5,local_58[0] + 1);
LAB_00112c2b:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&(this->output).ctx);
  pcVar1 = (this->output).testing._M_dataplus._M_p;
  paVar4 = &(this->output).testing.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar4) {
    operator_delete(pcVar1,paVar4->_M_allocated_capacity + 1);
  }
  return;
}

Assistant:

~confirm()
    {
        if ( failures > 0 )
        {
            os << failures << " out of " << selected << " selected " << pluralise("test", selected) << " " << colourise( "failed.\n" );
        }
        else if ( output.pass() )
        {
            os << "All " << selected << " selected " << pluralise("test", selected) << " " << colourise( "passed.\n" );
        }
    }